

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyOrthonormal<double>(Matrix44<double> *A)

{
  uint __line;
  long lVar1;
  long lVar2;
  Matrix44<double> *pMVar3;
  char *__assertion;
  Matrix44<double> prod;
  Matrix44<double> local_98;
  
  pMVar3 = &prod;
  Imath_3_2::Matrix44<double>::transposed(A);
  Imath_3_2::Matrix44<double>::multiply(A,&local_98);
  lVar1 = 0;
  do {
    if (lVar1 == 4) {
      return;
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (2.220446049250313e-14 < ABS(*(double *)((long)prod.x + lVar1 * 0x28) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) <= valueEps";
          __line = 0x30;
LAB_00149874:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,__line,
                        "void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = double]");
        }
      }
      else if (2.220446049250313e-14 < ABS(*(double *)((long)pMVar3 + lVar2 * 8))) {
        __assertion = "std::abs (prod[i][j]) <= valueEps";
        __line = 0x32;
        goto LAB_00149874;
      }
    }
    lVar1 = lVar1 + 1;
    pMVar3 = (Matrix44<double> *)((long)pMVar3 + 0x20);
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed ();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}